

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O2

void __thiscall QPDF::importJSON(QPDF *this,shared_ptr<InputSource> *is,bool must_be_complete)

{
  int iVar1;
  runtime_error *this_00;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  __shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> local_100;
  JSON local_f0 [3];
  JSONReactor reactor;
  
  std::__shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_100,&is->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>);
  JSONReactor::JSONReactor(&reactor,this,(shared_ptr<InputSource> *)&local_100,must_be_complete);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_100._M_refcount);
  JSON::parse(local_f0,(is->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
              &reactor.super_Reactor);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_f0[0].m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (reactor.errors == false) {
    JSONReactor::~JSONReactor(&reactor);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  iVar1 = (*((is->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            _vptr_InputSource[3])();
  std::operator+(&local_120,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(extraout_var,iVar1),": errors found in JSON");
  std::runtime_error::runtime_error(this_00,(string *)&local_120);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
QPDF::importJSON(std::shared_ptr<InputSource> is, bool must_be_complete)
{
    JSONReactor reactor(*this, is, must_be_complete);
    try {
        JSON::parse(*is, &reactor);
    } catch (std::runtime_error& e) {
        throw std::runtime_error(is->getName() + ": " + e.what());
    }
    if (reactor.anyErrors()) {
        throw std::runtime_error(is->getName() + ": errors found in JSON");
    }
}